

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.cc
# Opt level: O0

int hpke_key_schedule(EVP_HPKE_CTX *ctx,uint8_t mode,uint8_t *shared_secret,size_t shared_secret_len
                     ,uint8_t *info,size_t info_len)

{
  undefined8 uVar1;
  int iVar2;
  size_t sVar3;
  undefined4 extraout_var;
  size_t kKeyLen;
  uint8_t key [80];
  EVP_AEAD *aead;
  size_t secret_len;
  uint8_t secret [64];
  undefined1 local_1b0 [8];
  CBB context_cbb;
  size_t context_len;
  uint8_t context [129];
  size_t info_hash_len;
  uint8_t info_hash [64];
  size_t local_a0;
  size_t psk_id_hash_len;
  uint8_t psk_id_hash [64];
  EVP_MD *hkdf_md;
  uint8_t suite_id [10];
  size_t info_len_local;
  uint8_t *info_local;
  size_t shared_secret_len_local;
  uint8_t *shared_secret_local;
  uint8_t mode_local;
  EVP_HPKE_CTX *ctx_local;
  
  suite_id._2_8_ = info_len;
  iVar2 = hpke_build_suite_id(ctx,(uint8_t *)((long)&hkdf_md + 6));
  if (iVar2 != 0) {
    psk_id_hash._56_8_ = (*ctx->kdf->hkdf_md_func)();
    iVar2 = hpke_labeled_extract
                      ((EVP_MD *)psk_id_hash._56_8_,(uint8_t *)&psk_id_hash_len,&local_a0,
                       (uint8_t *)0x0,0,(uint8_t *)((long)&hkdf_md + 6),10,"psk_id_hash",
                       (uint8_t *)0x0,0);
    if ((iVar2 != 0) &&
       (iVar2 = hpke_labeled_extract
                          ((EVP_MD *)psk_id_hash._56_8_,(uint8_t *)&info_hash_len,
                           (size_t *)(context + 0x80),(uint8_t *)0x0,0,
                           (uint8_t *)((long)&hkdf_md + 6),10,"info_hash",info,suite_id._2_8_),
       iVar2 != 0)) {
      CBB_init_fixed((CBB *)local_1b0,(uint8_t *)&context_len,0x81);
      iVar2 = CBB_add_u8((CBB *)local_1b0,mode);
      if ((iVar2 != 0) &&
         (((iVar2 = CBB_add_bytes((CBB *)local_1b0,(uint8_t *)&psk_id_hash_len,local_a0), iVar2 != 0
           && (iVar2 = CBB_add_bytes((CBB *)local_1b0,(uint8_t *)&info_hash_len,
                                     stack0xffffffffffffff10), iVar2 != 0)) &&
          (iVar2 = CBB_finish((CBB *)local_1b0,(uint8_t **)0x0,
                              (size_t *)((long)&context_cbb.u + 0x18)), iVar2 != 0)))) {
        iVar2 = hpke_labeled_extract
                          ((EVP_MD *)psk_id_hash._56_8_,(uint8_t *)&secret_len,(size_t *)&aead,
                           shared_secret,shared_secret_len,(uint8_t *)((long)&hkdf_md + 6),10,
                           "secret",(uint8_t *)0x0,0);
        if (iVar2 == 0) {
          return 0;
        }
        key._72_8_ = EVP_HPKE_AEAD_aead(ctx->aead);
        sVar3 = EVP_AEAD_key_length((EVP_AEAD *)key._72_8_);
        iVar2 = hpke_labeled_expand((EVP_MD *)psk_id_hash._56_8_,(uint8_t *)&kKeyLen,sVar3,
                                    (uint8_t *)&secret_len,(size_t)aead,
                                    (uint8_t *)((long)&hkdf_md + 6),10,"key",(uint8_t *)&context_len
                                    ,context_cbb.u._24_8_);
        if ((iVar2 == 0) ||
           (iVar2 = EVP_AEAD_CTX_init(&ctx->aead_ctx,(EVP_AEAD *)key._72_8_,(uint8_t *)&kKeyLen,
                                      sVar3,0,(ENGINE *)0x0), uVar1 = psk_id_hash._56_8_, iVar2 == 0
           )) {
          return 0;
        }
        sVar3 = EVP_AEAD_nonce_length((EVP_AEAD *)key._72_8_);
        iVar2 = hpke_labeled_expand((EVP_MD *)uVar1,ctx->base_nonce,sVar3,(uint8_t *)&secret_len,
                                    (size_t)aead,(uint8_t *)((long)&hkdf_md + 6),10,"base_nonce",
                                    (uint8_t *)&context_len,context_cbb.u._24_8_);
        uVar1 = psk_id_hash._56_8_;
        if (iVar2 == 0) {
          return 0;
        }
        iVar2 = EVP_MD_size((EVP_MD *)psk_id_hash._56_8_);
        iVar2 = hpke_labeled_expand((EVP_MD *)uVar1,ctx->exporter_secret,
                                    CONCAT44(extraout_var,iVar2),(uint8_t *)&secret_len,(size_t)aead
                                    ,(uint8_t *)((long)&hkdf_md + 6),10,"exp",
                                    (uint8_t *)&context_len,context_cbb.u._24_8_);
        if (iVar2 != 0) {
          return 1;
        }
        return 0;
      }
    }
  }
  return 0;
}

Assistant:

static int hpke_key_schedule(EVP_HPKE_CTX *ctx, uint8_t mode,
                             const uint8_t *shared_secret,
                             size_t shared_secret_len, const uint8_t *info,
                             size_t info_len) {
  uint8_t suite_id[HPKE_SUITE_ID_LEN];
  if (!hpke_build_suite_id(ctx, suite_id)) {
    return 0;
  }

  // psk_id_hash = LabeledExtract("", "psk_id_hash", psk_id)
  // TODO(davidben): Precompute this value and store it with the EVP_HPKE_KDF.
  const EVP_MD *hkdf_md = ctx->kdf->hkdf_md_func();
  uint8_t psk_id_hash[EVP_MAX_MD_SIZE];
  size_t psk_id_hash_len;
  if (!hpke_labeled_extract(hkdf_md, psk_id_hash, &psk_id_hash_len, NULL, 0,
                            suite_id, sizeof(suite_id), "psk_id_hash", NULL,
                            0)) {
    return 0;
  }

  // info_hash = LabeledExtract("", "info_hash", info)
  uint8_t info_hash[EVP_MAX_MD_SIZE];
  size_t info_hash_len;
  if (!hpke_labeled_extract(hkdf_md, info_hash, &info_hash_len, NULL, 0,
                            suite_id, sizeof(suite_id), "info_hash", info,
                            info_len)) {
    return 0;
  }

  // key_schedule_context = concat(mode, psk_id_hash, info_hash)
  uint8_t context[sizeof(uint8_t) + 2 * EVP_MAX_MD_SIZE];
  size_t context_len;
  CBB context_cbb;
  CBB_init_fixed(&context_cbb, context, sizeof(context));
  if (!CBB_add_u8(&context_cbb, mode) ||
      !CBB_add_bytes(&context_cbb, psk_id_hash, psk_id_hash_len) ||
      !CBB_add_bytes(&context_cbb, info_hash, info_hash_len) ||
      !CBB_finish(&context_cbb, NULL, &context_len)) {
    return 0;
  }

  // secret = LabeledExtract(shared_secret, "secret", psk)
  uint8_t secret[EVP_MAX_MD_SIZE];
  size_t secret_len;
  if (!hpke_labeled_extract(hkdf_md, secret, &secret_len, shared_secret,
                            shared_secret_len, suite_id, sizeof(suite_id),
                            "secret", NULL, 0)) {
    return 0;
  }

  // key = LabeledExpand(secret, "key", key_schedule_context, Nk)
  const EVP_AEAD *aead = EVP_HPKE_AEAD_aead(ctx->aead);
  uint8_t key[EVP_AEAD_MAX_KEY_LENGTH];
  const size_t kKeyLen = EVP_AEAD_key_length(aead);
  if (!hpke_labeled_expand(hkdf_md, key, kKeyLen, secret, secret_len, suite_id,
                           sizeof(suite_id), "key", context, context_len) ||
      !EVP_AEAD_CTX_init(&ctx->aead_ctx, aead, key, kKeyLen,
                         EVP_AEAD_DEFAULT_TAG_LENGTH, NULL)) {
    return 0;
  }

  // base_nonce = LabeledExpand(secret, "base_nonce", key_schedule_context, Nn)
  if (!hpke_labeled_expand(hkdf_md, ctx->base_nonce,
                           EVP_AEAD_nonce_length(aead), secret, secret_len,
                           suite_id, sizeof(suite_id), "base_nonce", context,
                           context_len)) {
    return 0;
  }

  // exporter_secret = LabeledExpand(secret, "exp", key_schedule_context, Nh)
  if (!hpke_labeled_expand(hkdf_md, ctx->exporter_secret, EVP_MD_size(hkdf_md),
                           secret, secret_len, suite_id, sizeof(suite_id),
                           "exp", context, context_len)) {
    return 0;
  }

  return 1;
}